

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Maybe<kj::String> * __thiscall
kj::anon_unknown_8::DiskHandle::tryReadlink
          (Maybe<kj::String> *__return_storage_ptr__,DiskHandle *this,PathPtr path)

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  undefined1 uVar4;
  ulong size;
  int *piVar5;
  char *__buf;
  char *pcVar6;
  ulong elementCount;
  Array<char> buf_heap;
  Fault f;
  char buf_stack [256];
  char *local_1a8;
  size_t local_1a0;
  ArrayDisposer *local_198;
  char *local_188;
  ulong uStack_180;
  undefined8 *local_178;
  String local_168;
  PathPtr local_148;
  char local_138 [264];
  
  local_148.parts.size_ = path.parts.size_;
  local_148.parts.ptr = path.parts.ptr;
  uVar4 = (__return_storage_ptr__->ptr).isSet;
  local_1a8 = (__return_storage_ptr__->ptr).field_1.value.content.ptr;
  local_1a0 = (__return_storage_ptr__->ptr).field_1.value.content.size_;
  local_198 = (__return_storage_ptr__->ptr).field_1.value.content.disposer;
  elementCount = 0x100;
  do {
    if (elementCount < 0x101) {
      local_188 = (char *)0x0;
      uStack_180 = 0;
      local_178 = (undefined8 *)0x0;
    }
    else {
      local_188 = (char *)kj::_::HeapArrayDisposer::allocateImpl
                                    (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                                     (_func_void_void_ptr *)0x0);
      local_178 = &kj::_::HeapArrayDisposer::instance;
      uStack_180 = elementCount;
    }
    if (elementCount < 0x101) {
      uStack_180 = elementCount;
    }
    __buf = local_188;
    if (elementCount < 0x101) {
      __buf = local_138;
    }
    iVar1 = (this->fd).fd;
    PathPtr::toString(&local_168,&local_148,false);
    pcVar6 = "";
    if (local_168.content.size_ != 0) {
      pcVar6 = local_168.content.ptr;
    }
    size = readlinkat(iVar1,pcVar6,__buf,uStack_180);
    sVar3 = local_168.content.size_;
    pcVar6 = local_168.content.ptr;
    if (local_168.content.ptr != (char *)0x0) {
      local_168.content.ptr = (char *)0x0;
      local_168.content.size_ = 0;
      (**(local_168.content.disposer)->_vptr_ArrayDisposer)
                (local_168.content.disposer,pcVar6,1,sVar3,sVar3,0);
    }
    if ((long)size < 0) {
      piVar5 = __errno_location();
      iVar1 = *piVar5;
      if (iVar1 < 0x14) {
        if (iVar1 != 2) {
          bVar2 = true;
          if (iVar1 == 4) goto LAB_004c21d0;
LAB_004c2188:
          kj::_::Debug::Fault::Fault<int,kj::PathPtr&>
                    ((Fault *)&local_168,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x321,iVar1,"readlinkat(fd, path)","path",&local_148);
          kj::_::Debug::Fault::~Fault((Fault *)&local_168);
        }
      }
      else if ((iVar1 != 0x14) && (iVar1 != 0x16)) goto LAB_004c2188;
      uVar4 = false;
LAB_004c21ce:
      bVar2 = false;
    }
    else {
      if (size < uStack_180) {
        heapString(&local_168,__buf,size);
        local_1a8 = local_168.content.ptr;
        local_1a0 = local_168.content.size_;
        local_198 = local_168.content.disposer;
        uVar4 = true;
        goto LAB_004c21ce;
      }
      elementCount = elementCount * 2;
      bVar2 = true;
    }
LAB_004c21d0:
    if (local_188 != (char *)0x0) {
      (**(code **)*local_178)(local_178,local_188,1);
    }
    if (!bVar2) {
      (__return_storage_ptr__->ptr).field_1.value.content.ptr = local_1a8;
      (__return_storage_ptr__->ptr).field_1.value.content.size_ = local_1a0;
      (__return_storage_ptr__->ptr).field_1.value.content.disposer = local_198;
      (__return_storage_ptr__->ptr).isSet = (bool)uVar4;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Maybe<String> tryReadlink(PathPtr path) const {
    size_t trySize = 256;
    for (;;) {
      KJ_STACK_ARRAY(char, buf, trySize, 256, 4096);
      ssize_t n = readlinkat(fd, path.toString().cStr(), buf.begin(), buf.size());
      if (n < 0) {
        int error = errno;
        switch (error) {
          case EINTR:
            continue;
          case ENOENT:
          case ENOTDIR:
          case EINVAL:    // not a link
            return nullptr;
          default:
            KJ_FAIL_SYSCALL("readlinkat(fd, path)", error, path) { return nullptr; }
        }
      }

      if (n >= buf.size()) {
        // Didn't give it enough space. Better retry with a bigger buffer.
        trySize *= 2;
        continue;
      }

      return heapString(buf.begin(), n);
    }
  }